

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
               (Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
                *m)

{
  undefined4 local_dc;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_d8;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  pair<unsigned_int,_unsigned_int> local_68;
  ulong uStack_60;
  undefined8 *local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0x39f);
  uStack_60 = uStack_60 & 0xffffffffffffff00;
  local_68 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_00217dd8;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  pcStack_50 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_90 = "";
  local_d8._M_array =
       (iterator)
       CONCAT44(local_d8._M_array._4_4_,
                (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_);
  local_dc = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_68,&local_98,0x39f,1,2,&local_d8,"m.get_max_dimension()",&local_dc,"2");
  local_68.first = 0;
  local_68.second = 1;
  uStack_60 = 0x400000001;
  local_58 = (undefined8 *)0x100000002;
  pcStack_50 = (char *)0x400000003;
  local_48 = 0x100000004;
  uStack_40 = 0x400000005;
  local_d8._M_len = 6;
  local_d8._M_array = &local_68;
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>
              *)m,&local_d8,-1);
  local_68.first = 0;
  local_68.second = 1;
  uStack_60 = 0x400000001;
  local_58 = (undefined8 *)0x100000002;
  pcStack_50 = (char *)0x400000003;
  local_d8._M_len = 4;
  local_d8._M_array = &local_68;
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>
  ::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>
              *)m,&local_d8,-1);
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x3a9);
  uStack_60 = uStack_60 & 0xffffffffffffff00;
  local_68 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_00217dd8;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  pcStack_50 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c0 = "";
  local_d8._M_array =
       (iterator)
       CONCAT44(local_d8._M_array._4_4_,
                (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_);
  local_dc = 5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_68,&local_c8,0x3a9,1,2,&local_d8,"m.get_max_dimension()",&local_dc,"5");
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}